

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-time-dependent.h
# Opt level: O0

void __thiscall
dynamicgraph::SignalTimeDependent<double,_int>::SignalTimeDependent
          (SignalTimeDependent<double,_int> *this,function2<double_&,_double_&,_int> *t,
          SignalArray_const<int> *sig,string *name)

{
  _func_int *p_Var1;
  function2<double_&,_double_&,_int> local_78;
  string local_48;
  string *local_28;
  string *name_local;
  SignalArray_const<int> *sig_local;
  function2<double_&,_double_&,_int> *t_local;
  SignalTimeDependent<double,_int> *this_local;
  
  local_28 = name;
  name_local = (string *)sig;
  sig_local = (SignalArray_const<int> *)t;
  t_local = (function2<double_&,_double_&,_int> *)this;
  std::__cxx11::string::string((string *)&local_48,(string *)name);
  Signal<double,_int>::Signal((Signal<double,_int> *)&this->field_0x40,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_TimeDependency<int>)._vptr_TimeDependency =
       (_func_int **)&PTR__SignalTimeDependent_0017d548;
  *(undefined ***)&this->field_0x40 = &PTR__SignalTimeDependent_0017d6b8;
  TimeDependency<int>::TimeDependency
            (&this->super_TimeDependency<int>,
             (SignalBase<int> *)
             ((long)&(this->super_TimeDependency<int>)._vptr_TimeDependency +
             (long)(this->super_TimeDependency<int>)._vptr_TimeDependency[-3]),
             (SignalArray_const<int> *)name_local,TIME_DEPENDENT);
  (this->super_TimeDependency<int>)._vptr_TimeDependency =
       (_func_int **)&PTR__SignalTimeDependent_0017d548;
  *(undefined ***)&this->field_0x40 = &PTR__SignalTimeDependent_0017d6b8;
  p_Var1 = (_func_int *)
           ((long)&(this->super_TimeDependency<int>)._vptr_TimeDependency +
           (long)(this->super_TimeDependency<int>)._vptr_TimeDependency[-3]);
  boost::function2<double_&,_double_&,_int>::function2(&local_78,t);
  (**(code **)(*(long *)p_Var1 + 0xd8))(p_Var1,&local_78,0);
  boost::function2<double_&,_double_&,_int>::~function2(&local_78);
  return;
}

Assistant:

SignalTimeDependent<T, Time>::SignalTimeDependent(
    boost::function2<T &, T &, Time> t, const SignalArray_const<Time> &sig,
    std::string name)
    : Signal<T, Time>(name), TimeDependency<Time>(this, sig) {
  this->setFunction(t);
}